

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void compare_une(CPUMIPSState_conflict10 *env,wr_t *pwd,wr_t *pws,wr_t *pwt,uint32_t df,int quiet,
                uintptr_t retaddr)

{
  int32_t *piVar1;
  float_status *pfVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  float32 fVar8;
  float64 fVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  ulong *puVar18;
  wr_t wx;
  ulong local_48;
  ulong uStack_40;
  wr_t *local_38;
  
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  local_38 = pwd;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar15 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      if (quiet == 0) {
        iVar5 = float32_unordered_mips64el(pws->w[lVar15],pwt->w[lVar15],pfVar2);
      }
      else {
        iVar5 = float32_unordered_quiet_mips64el(pws->w[lVar15],pwt->w[lVar15],pfVar2);
      }
      uVar11 = -(uint)(iVar5 != 0);
      *(uint *)((long)&local_48 + lVar15 * 4) = uVar11;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar7 = ieee_ex_to_mips_mips64el((uint)bVar3);
      uVar10 = (env->active_tc).msacsr;
      uVar6 = uVar7 & 0xfffffffe;
      if ((uVar10 >> 0x18 & 1) == 0) {
        uVar6 = uVar7;
      }
      if ((bVar3 & 0x40) == 0) {
        uVar6 = uVar7;
      }
      uVar7 = uVar6 | 3;
      if ((uVar10 >> 0x18 & 1) == 0) {
        uVar7 = uVar6;
      }
      uVar13 = uVar10 >> 7 & 0x1f | 0x20;
      if (-1 < (char)bVar3) {
        uVar7 = uVar6;
      }
      uVar12 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar7 >> 2);
      uVar14 = uVar12 | uVar7;
      uVar6 = uVar7 & 0xfffffffc;
      if ((uVar12 != 0 || (uVar7 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar6 = uVar14;
      }
      if ((uVar7 & 2) == 0) {
        uVar6 = uVar14;
      }
      if ((uVar6 & uVar13) == 0) {
        uVar7 = uVar6 << 0xc;
LAB_0096b5cd:
        (env->active_tc).msacsr = uVar7 & 0x3f000 | uVar10;
        uVar13 = uVar10 >> 7 & 0x1f | 0x20;
      }
      else if ((uVar10 >> 0x12 & 1) == 0) {
        uVar7 = uVar6 << 0xc | uVar10;
        uVar10 = uVar10 & 0xfff80fff;
        goto LAB_0096b5cd;
      }
      if ((uVar13 & uVar6) != 0) {
        fVar8 = float32_default_nan_mips64el(pfVar2);
        uVar11 = fVar8 & 0xffffffc0 ^ 0x400000 | uVar6;
        *(uint *)((long)&local_48 + lVar15 * 4) = uVar11;
      }
      if (uVar11 == 0) {
        (env->active_tc).msa_fp_status.float_exception_flags = '\0';
        if (quiet == 0) {
          iVar5 = float32_lt_mips64el(pws->w[lVar15],pwt->w[lVar15],pfVar2);
        }
        else {
          iVar5 = float32_lt_quiet_mips64el(pws->w[lVar15],pwt->w[lVar15],pfVar2);
        }
        uVar11 = -(uint)(iVar5 != 0);
        *(uint *)((long)&local_48 + lVar15 * 4) = uVar11;
        bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar7 = ieee_ex_to_mips_mips64el((uint)bVar3);
        uVar10 = (env->active_tc).msacsr;
        uVar6 = uVar7 & 0xfffffffe;
        if ((uVar10 >> 0x18 & 1) == 0) {
          uVar6 = uVar7;
        }
        if ((bVar3 & 0x40) == 0) {
          uVar6 = uVar7;
        }
        uVar7 = uVar6 | 3;
        if ((uVar10 >> 0x18 & 1) == 0) {
          uVar7 = uVar6;
        }
        uVar13 = uVar10 >> 7 & 0x1f | 0x20;
        if (-1 < (char)bVar3) {
          uVar7 = uVar6;
        }
        uVar14 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar7 >> 2);
        uVar12 = uVar14 | uVar7;
        uVar6 = uVar7 & 0xfffffffc;
        if ((uVar14 != 0 || (uVar7 & 1) != 0) || (uVar10 & 0x100) != 0) {
          uVar6 = uVar12;
        }
        if ((uVar7 & 2) == 0) {
          uVar6 = uVar12;
        }
        if ((uVar6 & uVar13) == 0) {
          uVar7 = uVar6 << 0xc;
LAB_0096b6ec:
          (env->active_tc).msacsr = uVar7 & 0x3f000 | uVar10;
          uVar13 = uVar10 >> 7 & 0x1f | 0x20;
        }
        else if ((uVar10 >> 0x12 & 1) == 0) {
          uVar7 = uVar6 << 0xc | uVar10;
          uVar10 = uVar10 & 0xfff80fff;
          goto LAB_0096b6ec;
        }
        if ((uVar13 & uVar6) != 0) {
          fVar8 = float32_default_nan_mips64el(pfVar2);
          uVar11 = fVar8 & 0xffffffc0 ^ 0x400000 | uVar6;
          *(uint *)((long)&local_48 + lVar15 * 4) = uVar11;
        }
        if (uVar11 == 0) {
          (env->active_tc).msa_fp_status.float_exception_flags = '\0';
          if (quiet == 0) {
            iVar5 = float32_lt_mips64el(pwt->w[lVar15],pws->w[lVar15],pfVar2);
          }
          else {
            iVar5 = float32_lt_quiet_mips64el(pwt->w[lVar15],pws->w[lVar15],pfVar2);
          }
          *(uint *)((long)&local_48 + lVar15 * 4) = -(uint)(iVar5 != 0);
          bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
          uVar6 = ieee_ex_to_mips_mips64el((uint)bVar3);
          uVar10 = (env->active_tc).msacsr;
          uVar11 = uVar6 & 0xfffffffe;
          if ((uVar10 >> 0x18 & 1) == 0) {
            uVar11 = uVar6;
          }
          if ((bVar3 & 0x40) == 0) {
            uVar11 = uVar6;
          }
          uVar6 = uVar11 | 3;
          if ((uVar10 >> 0x18 & 1) == 0) {
            uVar6 = uVar11;
          }
          if (-1 < (char)bVar3) {
            uVar6 = uVar11;
          }
          uVar7 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
          uVar13 = uVar7 | uVar6;
          uVar11 = uVar6 & 0xfffffffc;
          if ((uVar7 != 0 || (uVar6 & 1) != 0) || (uVar10 & 0x100) != 0) {
            uVar11 = uVar13;
          }
          if ((uVar6 & 2) == 0) {
            uVar11 = uVar13;
          }
          if ((uVar11 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
            uVar6 = uVar11 << 0xc;
LAB_0096b808:
            (env->active_tc).msacsr = uVar6 & 0x3f000 | uVar10;
            if (((uVar10 >> 7 & 0x1f | 0x20) & uVar11) == 0) goto LAB_0096b839;
          }
          else if ((uVar10 >> 0x12 & 1) == 0) {
            uVar6 = uVar11 << 0xc | uVar10;
            uVar10 = uVar10 & 0xfff80fff;
            goto LAB_0096b808;
          }
          fVar8 = float32_default_nan_mips64el(pfVar2);
          *(float32 *)((long)&local_48 + lVar15 * 4) = fVar8 & 0xffffffc0 ^ 0x400000 | uVar11;
        }
      }
LAB_0096b839:
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x179d,
                    "void compare_une(CPUMIPSState *, wr_t *, wr_t *, wr_t *, uint32_t, int, uintptr_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    puVar18 = &local_48;
    lVar15 = 0;
    bVar4 = true;
    do {
      bVar17 = bVar4;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      if (quiet == 0) {
        iVar5 = float64_unordered_mips64el(pws->d[lVar15],pwt->d[lVar15],pfVar2);
      }
      else {
        iVar5 = float64_unordered_quiet_mips64el(pws->d[lVar15],pwt->d[lVar15],pfVar2);
      }
      uVar16 = -(ulong)(iVar5 != 0);
      *puVar18 = uVar16;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar6 = ieee_ex_to_mips_mips64el((uint)bVar3);
      uVar10 = (env->active_tc).msacsr;
      uVar11 = uVar6 & 0xfffffffe;
      if ((uVar10 >> 0x18 & 1) == 0) {
        uVar11 = uVar6;
      }
      if ((bVar3 & 0x40) == 0) {
        uVar11 = uVar6;
      }
      uVar6 = uVar11 | 3;
      if ((uVar10 >> 0x18 & 1) == 0) {
        uVar6 = uVar11;
      }
      uVar7 = uVar10 >> 7 & 0x1f | 0x20;
      if (-1 < (char)bVar3) {
        uVar6 = uVar11;
      }
      uVar13 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
      uVar12 = uVar13 | uVar6;
      uVar11 = uVar6 & 0xfffffffc;
      if ((uVar13 != 0 || (uVar6 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar11 = uVar12;
      }
      if ((uVar6 & 2) == 0) {
        uVar11 = uVar12;
      }
      if ((uVar11 & uVar7) == 0) {
        uVar6 = uVar11 << 0xc;
LAB_0096b23e:
        (env->active_tc).msacsr = uVar6 & 0x3f000 | uVar10;
        uVar7 = uVar10 >> 7 & 0x1f | 0x20;
      }
      else if ((uVar10 >> 0x12 & 1) == 0) {
        uVar6 = uVar11 << 0xc | uVar10;
        uVar10 = uVar10 & 0xfff80fff;
        goto LAB_0096b23e;
      }
      if ((uVar7 & uVar11) != 0) {
        fVar9 = float64_default_nan_mips64el(pfVar2);
        uVar16 = (long)(int)uVar11 | fVar9 & 0xffffffffffffffc0 ^ 0x8000000000000;
        *puVar18 = uVar16;
      }
      if (uVar16 == 0) {
        (env->active_tc).msa_fp_status.float_exception_flags = '\0';
        if (quiet == 0) {
          iVar5 = float64_lt_mips64el(pws->d[lVar15],pwt->d[lVar15],pfVar2);
        }
        else {
          iVar5 = float64_lt_quiet_mips64el(pws->d[lVar15],pwt->d[lVar15],pfVar2);
        }
        uVar16 = -(ulong)(iVar5 != 0);
        *puVar18 = uVar16;
        bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar6 = ieee_ex_to_mips_mips64el((uint)bVar3);
        uVar10 = (env->active_tc).msacsr;
        uVar11 = uVar6 & 0xfffffffe;
        if ((uVar10 >> 0x18 & 1) == 0) {
          uVar11 = uVar6;
        }
        if ((bVar3 & 0x40) == 0) {
          uVar11 = uVar6;
        }
        uVar6 = uVar11 | 3;
        if ((uVar10 >> 0x18 & 1) == 0) {
          uVar6 = uVar11;
        }
        uVar7 = uVar10 >> 7 & 0x1f | 0x20;
        if (-1 < (char)bVar3) {
          uVar6 = uVar11;
        }
        uVar12 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
        uVar13 = uVar12 | uVar6;
        uVar11 = uVar6 & 0xfffffffc;
        if ((uVar12 != 0 || (uVar6 & 1) != 0) || (uVar10 & 0x100) != 0) {
          uVar11 = uVar13;
        }
        if ((uVar6 & 2) == 0) {
          uVar11 = uVar13;
        }
        if ((uVar11 & uVar7) == 0) {
          uVar6 = uVar11 << 0xc;
LAB_0096b365:
          (env->active_tc).msacsr = uVar6 & 0x3f000 | uVar10;
          uVar7 = uVar10 >> 7 & 0x1f | 0x20;
        }
        else if ((uVar10 >> 0x12 & 1) == 0) {
          uVar6 = uVar11 << 0xc | uVar10;
          uVar10 = uVar10 & 0xfff80fff;
          goto LAB_0096b365;
        }
        if ((uVar7 & uVar11) != 0) {
          fVar9 = float64_default_nan_mips64el(pfVar2);
          uVar16 = (long)(int)uVar11 | fVar9 & 0xffffffffffffffc0 ^ 0x8000000000000;
          *puVar18 = uVar16;
        }
        if (uVar16 == 0) {
          (env->active_tc).msa_fp_status.float_exception_flags = '\0';
          if (quiet == 0) {
            iVar5 = float64_lt_mips64el(pwt->d[lVar15],pws->d[lVar15],pfVar2);
          }
          else {
            iVar5 = float64_lt_quiet_mips64el(pwt->d[lVar15],pws->d[lVar15],pfVar2);
          }
          *puVar18 = -(ulong)(iVar5 != 0);
          bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
          uVar6 = ieee_ex_to_mips_mips64el((uint)bVar3);
          uVar10 = (env->active_tc).msacsr;
          uVar11 = uVar6 & 0xfffffffe;
          if ((uVar10 >> 0x18 & 1) == 0) {
            uVar11 = uVar6;
          }
          if ((bVar3 & 0x40) == 0) {
            uVar11 = uVar6;
          }
          uVar6 = uVar11 | 3;
          if ((uVar10 >> 0x18 & 1) == 0) {
            uVar6 = uVar11;
          }
          if (-1 < (char)bVar3) {
            uVar6 = uVar11;
          }
          uVar7 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
          uVar13 = uVar7 | uVar6;
          uVar11 = uVar6 & 0xfffffffc;
          if ((uVar7 != 0 || (uVar6 & 1) != 0) || (uVar10 & 0x100) != 0) {
            uVar11 = uVar13;
          }
          if ((uVar6 & 2) == 0) {
            uVar11 = uVar13;
          }
          if ((uVar11 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
            uVar6 = uVar11 << 0xc;
LAB_0096b48a:
            (env->active_tc).msacsr = uVar6 & 0x3f000 | uVar10;
            if (((uVar10 >> 7 & 0x1f | 0x20) & uVar11) == 0) goto LAB_0096b4c8;
          }
          else if ((uVar10 >> 0x12 & 1) == 0) {
            uVar6 = uVar11 << 0xc | uVar10;
            uVar10 = uVar10 & 0xfff80fff;
            goto LAB_0096b48a;
          }
          fVar9 = float64_default_nan_mips64el(pfVar2);
          *puVar18 = (long)(int)uVar11 | fVar9 & 0xffffffffffffffc0 ^ 0x8000000000000;
        }
      }
LAB_0096b4c8:
      lVar15 = 1;
      puVar18 = &uStack_40;
      bVar4 = false;
    } while (bVar17);
  }
  uVar10 = (env->active_tc).msacsr;
  uVar11 = uVar10 >> 7 & 0x1f | 0x20;
  if ((uVar11 & uVar10 >> 0xc) != 0) {
    do_raise_exception(env,(uint32_t)retaddr,(ulong)uVar11);
  }
  (env->active_tc).msacsr = (uVar10 >> 0xc & 0x1f) << 2 | uVar10;
  local_38->d[0] = local_48;
  local_38->d[1] = uStack_40;
  return;
}

Assistant:

static inline void compare_une(CPUMIPSState *env, wr_t *pwd, wr_t *pws,
                               wr_t *pwt, uint32_t df, int quiet,
                               uintptr_t retaddr)
{
    wr_t wx, *pwx = &wx;
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNE(pwx->w[i], pws->w[i], pwt->w[i], 32, quiet);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNE(pwx->d[i], pws->d[i], pwt->d[i], 64, quiet);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, retaddr);

    msa_move_v(pwd, pwx);
}